

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::create_directories(Twine *Path,bool IgnoreExisting,perms Perms)

{
  uint uVar1;
  error_category *peVar2;
  undefined8 uVar3;
  ulong uVar5;
  StringRef path;
  error_code eVar6;
  StringRef P;
  StringRef Parent;
  Twine local_c8;
  SmallString<128U> PathStorage;
  error_category *peVar4;
  
  PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &PathStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  uVar3 = 0;
  PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  P = Twine::toStringRef(Path,(SmallVectorImpl<char> *)&PathStorage);
  Twine::Twine(&local_c8,&P);
  eVar6 = create_directory(&local_c8,IgnoreExisting,Perms);
  peVar4 = eVar6._M_cat;
  uVar1 = eVar6._M_value;
  uVar5 = (ulong)uVar1;
  peVar2 = (error_category *)std::_V2::generic_category();
  if (uVar1 == 2 && peVar4 == peVar2) {
    uVar5 = 2;
    path.Length = 2;
    path.Data = (char *)P.Length;
    Parent = sys::path::parent_path
                       ((path *)P.Data,path,
                        (Style)CONCAT71((int7)((ulong)uVar3 >> 8),uVar1 != 2 || peVar4 != peVar2));
    if (Parent.Length != 0) {
      Twine::Twine(&local_c8,&Parent);
      eVar6 = create_directories(&local_c8,IgnoreExisting,Perms);
      if (eVar6._M_value == 0) {
        Twine::Twine(&local_c8,&P);
        eVar6 = create_directory(&local_c8,IgnoreExisting,Perms);
      }
      peVar4 = eVar6._M_cat;
      uVar5 = (ulong)(uint)eVar6._M_value;
    }
  }
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&PathStorage);
  eVar6._M_cat = peVar4;
  eVar6._0_8_ = uVar5;
  return eVar6;
}

Assistant:

std::error_code create_directories(const Twine &Path, bool IgnoreExisting,
                                   perms Perms) {
  SmallString<128> PathStorage;
  StringRef P = Path.toStringRef(PathStorage);

  // Be optimistic and try to create the directory
  std::error_code EC = create_directory(P, IgnoreExisting, Perms);
  // If we succeeded, or had any error other than the parent not existing, just
  // return it.
  if (EC != errc::no_such_file_or_directory)
    return EC;

  // We failed because of a no_such_file_or_directory, try to create the
  // parent.
  StringRef Parent = path::parent_path(P);
  if (Parent.empty())
    return EC;

  if ((EC = create_directories(Parent, IgnoreExisting, Perms)))
      return EC;

  return create_directory(P, IgnoreExisting, Perms);
}